

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O3

ssize_t __thiscall
wasm::LEB<unsigned_long,_unsigned_char>::write
          (LEB<unsigned_long,_unsigned_char> *this,int __fd,void *__buf,size_t __n)

{
  iterator iVar1;
  bool bVar2;
  byte bVar3;
  ulong in_RAX;
  ulong extraout_RAX;
  undefined4 in_register_00000034;
  vector<unsigned_char,std::allocator<unsigned_char>> *this_00;
  ulong uVar4;
  undefined8 uStack_28;
  
  this_00 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
            CONCAT44(in_register_00000034,__fd);
  uVar4 = this->value;
  bVar3 = (byte)uVar4;
  uStack_28._0_7_ = (undefined7)in_RAX;
  uStack_28 = CONCAT17(bVar3,(undefined7)uStack_28) & 0x7fffffffffffffff;
  if (0x7f < uVar4) {
    in_RAX = uVar4 & 0xffffffff;
    do {
      uStack_28 = CONCAT17((byte)in_RAX,(undefined7)uStack_28) | 0x8000000000000000;
      iVar1._M_current = *(uchar **)(this_00 + 8);
      if (iVar1._M_current == *(uchar **)(this_00 + 0x10)) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>(this_00,iVar1,(uchar *)((long)&uStack_28 + 7));
      }
      else {
        *iVar1._M_current = (byte)in_RAX | 0x80;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 1;
      }
      in_RAX = uVar4 >> 7;
      bVar3 = (byte)in_RAX;
      uStack_28 = CONCAT17(bVar3,(undefined7)uStack_28) & 0x7fffffffffffffff;
      bVar2 = 0x3fff < uVar4;
      uVar4 = in_RAX;
    } while (bVar2);
  }
  iVar1._M_current = *(uchar **)(this_00 + 8);
  if (iVar1._M_current == *(uchar **)(this_00 + 0x10)) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>(this_00,iVar1,(uchar *)((long)&uStack_28 + 7));
    in_RAX = extraout_RAX;
  }
  else {
    *iVar1._M_current = bVar3 & 0x7f;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 1;
  }
  return in_RAX;
}

Assistant:

void write(std::vector<uint8_t>* out) {
    T temp = value;
    bool more;
    do {
      uint8_t byte = temp & 127;
      temp >>= 7;
      more = hasMore(temp, byte);
      if (more) {
        byte = byte | 128;
      }
      out->push_back(byte);
    } while (more);
  }